

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86_avx::forward_int8
          (Padding_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _c;
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  int *piVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  Mat *pMVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  undefined8 *puVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  undefined8 *puVar28;
  undefined8 *puVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 in_ZMM6 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 in_ZMM7 [64];
  Mat m;
  Option opt_pack1;
  
  auVar35 = in_ZMM6._0_16_;
  auVar36 = in_ZMM7._0_16_;
  _c = bottom_blob->c;
  m.elemsize = bottom_blob->elemsize;
  m.elempack = bottom_blob->elempack;
  m.dims = bottom_blob->dims;
  m.w = bottom_blob->w;
  m.h = bottom_blob->h;
  iVar10 = bottom_blob->d;
  if (m.elempack == 8) {
    switch(m.dims) {
    case 1:
      uVar12 = (this->super_Padding).left;
      if ((((uVar12 & 7) == 0) &&
          (uVar12 = uVar12 + m.w * 8 + (this->super_Padding).right, (uVar12 & 7) == 0)) &&
         ((this->super_Padding).type == 0)) {
        Mat::create(top_blob,(int)uVar12 >> 3,m.elemsize & 0xfffffffffffffff8,8,opt->blob_allocator)
        ;
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          uVar30 = (ulong)(this->super_Padding).value;
          iVar10 = (this->super_Padding).left;
          iVar20 = iVar10 + 7;
          if (-1 < iVar10) {
            iVar20 = iVar10;
          }
          iVar10 = (this->super_Padding).right;
          iVar18 = iVar10 + 7;
          if (-1 < iVar10) {
            iVar18 = iVar10;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0,
                     iVar20 >> 3,iVar18 >> 3,
                     uVar30 << 0x38 | uVar30 << 0x30 | uVar30 << 0x28 |
                     uVar30 << 0x20 | uVar30 << 0x18 | uVar30 << 0x10 | uVar30 << 8 | uVar30);
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      uVar12 = (this->super_Padding).top;
      if ((((uVar12 & 7) == 0) &&
          (uVar12 = uVar12 + m.h * 8 + (this->super_Padding).bottom, (uVar12 & 7) == 0)) &&
         ((this->super_Padding).type == 0)) {
        Mat::create(top_blob,m.w + (this->super_Padding).left + (this->super_Padding).right,
                    (int)uVar12 >> 3,m.elemsize & 0xfffffffffffffff8,8,opt->blob_allocator);
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          uVar30 = (ulong)(this->super_Padding).value;
          iVar10 = (this->super_Padding).top;
          iVar20 = (this->super_Padding).bottom;
          iVar18 = iVar10 + 7;
          if (-1 < iVar10) {
            iVar18 = iVar10;
          }
          iVar10 = iVar20 + 7;
          if (-1 < iVar20) {
            iVar10 = iVar20;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                     iVar18 >> 3,iVar10 >> 3,(this->super_Padding).left,(this->super_Padding).right,
                     uVar30 << 0x38 | uVar30 << 0x30 | uVar30 << 0x28 |
                     uVar30 << 0x20 | uVar30 << 0x18 | uVar30 << 0x10 | uVar30 << 8 | uVar30);
          return 0;
        }
        return -100;
      }
      break;
    case 3:
      uVar12 = (this->super_Padding).front;
      uVar21 = uVar12 + _c * 8 + (this->super_Padding).behind;
      bVar32 = (uVar21 & 7) == 0;
      if (bVar32 && (uVar12 & 7) == 0) {
        if ((uVar21 == _c * 8) || ((this->super_Padding).type == 0)) {
          uVar21 = (int)uVar21 >> 3;
          Mat::create(top_blob,m.w + (this->super_Padding).left + (this->super_Padding).right,
                      m.h + (this->super_Padding).top + (this->super_Padding).bottom,uVar21,
                      (m.elemsize >> 3) << bVar32 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar10 = (this->super_Padding).front;
            iVar20 = iVar10 + 7;
            if (-1 < iVar10) {
              iVar20 = iVar10;
            }
            if ((int)uVar21 < 1) {
              return 0;
            }
            uVar30 = 0;
            auVar52 = ZEXT3264(_DAT_005a5c40);
            auVar35 = vpcmpeqd_avx(auVar36,auVar36);
            auVar53 = ZEXT1664(auVar35);
            uVar12 = -(iVar20 >> 3);
            do {
              pvVar6 = top_blob->data;
              uVar11 = top_blob->elemsize;
              uVar31 = (ulong)(this->super_Padding).value;
              sVar7 = top_blob->cstep;
              uVar31 = uVar31 << 0x38 | uVar31 << 0x30 | uVar31 << 0x28 |
                       uVar31 << 0x20 | uVar31 << 0x18 | uVar31 << 0x10 | uVar31 << 8 | uVar31;
              uVar9 = -(iVar20 >> 3) + (int)uVar30;
              auVar35 = auVar53._0_16_;
              if ((int)uVar9 < 0 || (int)_c <= (int)uVar9) {
                lVar15 = (long)top_blob->h * (long)top_blob->w;
                iVar10 = (int)((lVar15 * uVar11 + 0xf & 0xfffffffffffffff0) / uVar11);
                if (top_blob->dims == 4) {
                  iVar10 = (int)lVar15;
                }
                uVar9 = iVar10 * top_blob->d;
                if (0 < (int)uVar9) {
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = (ulong)uVar9 - 1;
                  auVar36 = vpshufd_avx(auVar33,0x44);
                  auVar34._8_8_ = 0;
                  auVar34._0_8_ = uVar31;
                  auVar37 = vpshufd_avx(auVar34,0x44);
                  auVar38._16_16_ = auVar37;
                  auVar38._0_16_ = auVar37;
                  auVar39._0_8_ = auVar36._0_8_ ^ 0x8000000000000000;
                  auVar39._8_4_ = auVar36._8_4_;
                  auVar39._12_4_ = auVar36._12_4_ ^ 0x80000000;
                  auVar41._0_8_ = auVar36._0_8_ ^ 0x8000000000000000;
                  auVar41._8_4_ = auVar39._8_4_;
                  auVar41._12_4_ = auVar36._12_4_ ^ 0x80000000;
                  uVar31 = 0;
                  do {
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = uVar31;
                    auVar36 = vpshufd_avx(auVar46,0x44);
                    auVar49._16_16_ = auVar36;
                    auVar49._0_16_ = auVar36;
                    auVar54 = vorps_avx(auVar49,auVar52._0_32_);
                    auVar51._0_8_ = auVar54._16_8_ ^ 0x8000000000000000;
                    auVar51._8_4_ = auVar54._24_4_;
                    auVar51._12_4_ = auVar54._28_4_ ^ 0x80000000;
                    auVar36 = vpcmpgtq_avx(auVar51,auVar39);
                    auVar47._0_8_ = auVar54._0_8_ ^ 0x8000000000000000;
                    auVar47._8_4_ = auVar54._8_4_;
                    auVar47._12_4_ = auVar54._12_4_ ^ 0x80000000;
                    auVar37 = vpcmpgtq_avx(auVar47,auVar41);
                    auVar50._16_16_ = auVar36 ^ auVar35;
                    auVar50._0_16_ = auVar37 ^ auVar35;
                    auVar54 = vmaskmovpd_avx(auVar50,auVar38);
                    *(undefined1 (*) [32])((long)pvVar6 + uVar31 * 8 + sVar7 * uVar11 * uVar30) =
                         auVar54;
                    uVar31 = uVar31 + 4;
                  } while ((uVar9 + 3 & 0xfffffffc) != uVar31);
                }
              }
              else {
                iVar10 = bottom_blob->w;
                lVar15 = (long)iVar10;
                iVar18 = bottom_blob->h;
                pvVar4 = bottom_blob->data;
                uVar13 = bottom_blob->elemsize;
                sVar5 = bottom_blob->cstep;
                puVar28 = (undefined8 *)(uVar9 * sVar5 * uVar13 + (long)pvVar4);
                m.elempack = bottom_blob->elempack;
                m.allocator = bottom_blob->allocator;
                m.refcount = (int *)0x0;
                m.c = bottom_blob->d;
                m.d = 1;
                m.dims = bottom_blob->dims + -1;
                m.cstep = (uVar13 * iVar18 * lVar15 + 0xf & 0xfffffffffffffff0) / uVar13;
                if (bottom_blob->dims == 4) {
                  m.cstep = iVar18 * lVar15;
                }
                pMVar14 = (Mat *)((long)pvVar6 + sVar7 * uVar30 * uVar11);
                iVar16 = (this->super_Padding).type;
                if (iVar16 == 0) {
                  m.data = puVar28;
                  m.elemsize = uVar13;
                  m.w = iVar10;
                  m.h = iVar18;
                  padding_constant_pack8_int8_sse
                            ((ncnn *)&m,pMVar14,(Mat *)(ulong)(uint)top_blob->w,
                             (this->super_Padding).top,(this->super_Padding).bottom,
                             (this->super_Padding).left,(this->super_Padding).right,uVar31);
                  auVar35 = vpcmpeqd_avx(auVar35,auVar35);
                  auVar53 = ZEXT1664(auVar35);
                  auVar52 = ZEXT3264(_DAT_005a5c40);
                  iVar16 = (this->super_Padding).type;
                }
                if (iVar16 == 2) {
                  iVar16 = (this->super_Padding).top;
                  iVar1 = (this->super_Padding).bottom;
                  uVar9 = (this->super_Padding).left;
                  lVar22 = (long)(int)uVar9;
                  uVar11 = (ulong)uVar9;
                  uVar3 = (this->super_Padding).right;
                  uVar31 = (ulong)uVar3;
                  lVar19 = (long)(iVar16 * iVar10);
                  if (iVar16 < 1) {
                    puVar28 = puVar28 + lVar19;
                  }
                  else {
                    lVar25 = sVar5 * uVar13 * (ulong)uVar12;
                    lVar26 = lVar25 + lVar22 * 8 + lVar19 * 8 + (long)pvVar4;
                    puVar28 = (undefined8 *)(lVar25 + lVar19 * 8 + (long)pvVar4);
                    iVar27 = 0;
                    do {
                      if (0 < (int)uVar9) {
                        lVar19 = 0;
                        do {
                          pMVar14->data = *(void **)(lVar26 + lVar19 * 8);
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          lVar19 = lVar19 + -1;
                        } while (-lVar19 != uVar11);
                      }
                      puVar23 = puVar28;
                      if (0 < iVar10) {
                        lVar19 = 0;
                        lVar25 = 0;
                        do {
                          (&pMVar14->data)[lVar25] = (void *)puVar28[lVar25];
                          lVar25 = lVar25 + 1;
                          lVar19 = lVar19 + -8;
                        } while (iVar10 != (int)lVar25);
                        pMVar14 = (Mat *)((long)pMVar14 - lVar19);
                        puVar23 = (undefined8 *)((long)puVar28 - lVar19);
                      }
                      if (0 < (int)uVar3) {
                        lVar19 = 0;
                        do {
                          pMVar14->data = (void *)puVar23[lVar19 + -2];
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          lVar19 = lVar19 + -1;
                        } while (-lVar19 != uVar31);
                      }
                      puVar28 = puVar28 + -lVar15;
                      iVar27 = iVar27 + 1;
                      lVar26 = lVar26 + lVar15 * -8;
                    } while (iVar27 != iVar16);
                  }
                  if (0 < iVar18) {
                    iVar16 = 0;
                    do {
                      if (0 < (int)uVar9) {
                        lVar19 = 0;
                        do {
                          pMVar14->data = (void *)puVar28[lVar22 + lVar19];
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          lVar19 = lVar19 + -1;
                        } while (-lVar19 != uVar11);
                      }
                      if (0 < iVar10) {
                        lVar19 = 0;
                        lVar25 = 0;
                        do {
                          (&pMVar14->data)[lVar25] = (void *)puVar28[lVar25];
                          lVar25 = lVar25 + 1;
                          lVar19 = lVar19 + -8;
                        } while (iVar10 != (int)lVar25);
                        pMVar14 = (Mat *)((long)pMVar14 - lVar19);
                        puVar28 = (undefined8 *)((long)puVar28 - lVar19);
                      }
                      if (0 < (int)uVar3) {
                        lVar19 = 0;
                        do {
                          pMVar14->data = (void *)puVar28[lVar19 + -2];
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          lVar19 = lVar19 + -1;
                        } while (-lVar19 != uVar31);
                      }
                      iVar16 = iVar16 + 1;
                    } while (iVar16 != iVar18);
                  }
                  if (0 < iVar1) {
                    puVar23 = puVar28 + -(long)(iVar10 * 2);
                    puVar28 = puVar28 + (lVar22 - iVar10 * 2);
                    iVar18 = 0;
                    do {
                      if (0 < (int)uVar9) {
                        lVar19 = 0;
                        do {
                          pMVar14->data = (void *)puVar28[lVar19];
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          lVar19 = lVar19 + -1;
                        } while (-lVar19 != uVar11);
                      }
                      puVar29 = puVar23;
                      if (0 < iVar10) {
                        lVar19 = 0;
                        lVar22 = 0;
                        do {
                          (&pMVar14->data)[lVar22] = (void *)puVar23[lVar22];
                          lVar22 = lVar22 + 1;
                          lVar19 = lVar19 + -8;
                        } while (iVar10 != (int)lVar22);
                        pMVar14 = (Mat *)((long)pMVar14 - lVar19);
                        puVar29 = (undefined8 *)((long)puVar23 - lVar19);
                      }
                      if (0 < (int)uVar3) {
                        lVar19 = 0;
                        do {
                          pMVar14->data = (void *)puVar29[lVar19 + -2];
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          lVar19 = lVar19 + -1;
                        } while (-lVar19 != uVar31);
                      }
                      puVar23 = puVar23 + -lVar15;
                      iVar18 = iVar18 + 1;
                      puVar28 = puVar28 + -lVar15;
                    } while (iVar18 != iVar1);
                  }
                }
                else if (iVar16 == 1) {
                  iVar16 = (this->super_Padding).top;
                  iVar1 = (this->super_Padding).bottom;
                  iVar27 = (this->super_Padding).left;
                  iVar2 = (this->super_Padding).right;
                  if (0 < iVar16) {
                    lVar19 = sVar5 * uVar13 * (ulong)uVar12;
                    iVar17 = 0;
                    do {
                      if (0 < iVar27) {
                        pvVar6 = (void *)*puVar28;
                        iVar24 = iVar27;
                        do {
                          pMVar14->data = pvVar6;
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          iVar24 = iVar24 + -1;
                        } while (iVar24 != 0);
                      }
                      puVar23 = puVar28;
                      if (0 < iVar10) {
                        lVar22 = 0;
                        lVar25 = 0;
                        do {
                          (&pMVar14->data)[lVar25] = *(void **)((long)pvVar4 + lVar25 * 8 + lVar19);
                          lVar25 = lVar25 + 1;
                          lVar22 = lVar22 + -8;
                        } while (iVar10 != (int)lVar25);
                        pMVar14 = (Mat *)((long)pMVar14 - lVar22);
                        puVar23 = (undefined8 *)((long)pvVar4 + (lVar19 - lVar22));
                      }
                      if (0 < iVar2) {
                        pvVar6 = (void *)puVar23[-1];
                        iVar24 = iVar2;
                        do {
                          pMVar14->data = pvVar6;
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          iVar24 = iVar24 + -1;
                        } while (iVar24 != 0);
                      }
                      iVar17 = iVar17 + 1;
                    } while (iVar17 != iVar16);
                  }
                  if (0 < iVar18) {
                    iVar16 = 0;
                    do {
                      if (0 < iVar27) {
                        pvVar6 = (void *)*puVar28;
                        iVar17 = iVar27;
                        do {
                          pMVar14->data = pvVar6;
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          iVar17 = iVar17 + -1;
                        } while (iVar17 != 0);
                      }
                      if (0 < iVar10) {
                        lVar19 = 0;
                        lVar22 = 0;
                        do {
                          (&pMVar14->data)[lVar22] = (void *)puVar28[lVar22];
                          lVar22 = lVar22 + 1;
                          lVar19 = lVar19 + -8;
                        } while (iVar10 != (int)lVar22);
                        pMVar14 = (Mat *)((long)pMVar14 - lVar19);
                        puVar28 = (undefined8 *)((long)puVar28 - lVar19);
                      }
                      if (0 < iVar2) {
                        pvVar6 = (void *)puVar28[-1];
                        iVar17 = iVar2;
                        do {
                          pMVar14->data = pvVar6;
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          iVar17 = iVar17 + -1;
                        } while (iVar17 != 0);
                      }
                      iVar16 = iVar16 + 1;
                    } while (iVar16 != iVar18);
                  }
                  if (0 < iVar1) {
                    puVar28 = puVar28 + -lVar15;
                    iVar18 = 0;
                    do {
                      if (0 < iVar27) {
                        pvVar6 = (void *)*puVar28;
                        iVar16 = iVar27;
                        do {
                          pMVar14->data = pvVar6;
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          iVar16 = iVar16 + -1;
                        } while (iVar16 != 0);
                      }
                      puVar23 = puVar28;
                      if (0 < iVar10) {
                        lVar15 = 0;
                        lVar19 = 0;
                        do {
                          (&pMVar14->data)[lVar19] = (void *)puVar28[lVar19];
                          lVar19 = lVar19 + 1;
                          lVar15 = lVar15 + -8;
                        } while (iVar10 != (int)lVar19);
                        pMVar14 = (Mat *)((long)pMVar14 - lVar15);
                        puVar23 = (undefined8 *)((long)puVar28 - lVar15);
                      }
                      if (0 < iVar2) {
                        pvVar6 = (void *)puVar23[-1];
                        iVar16 = iVar2;
                        do {
                          pMVar14->data = pvVar6;
                          pMVar14 = (Mat *)&pMVar14->refcount;
                          iVar16 = iVar16 + -1;
                        } while (iVar16 != 0);
                      }
                      iVar18 = iVar18 + 1;
                    } while (iVar18 != iVar1);
                  }
                }
              }
              uVar30 = uVar30 + 1;
              uVar12 = uVar12 + 1;
            } while (uVar30 != uVar21);
            return 0;
          }
          return -100;
        }
      }
      break;
    case 4:
      if ((this->super_Padding).type == 0) {
        uVar12 = (this->super_Padding).front + iVar10 + (this->super_Padding).behind;
        Mat::create(top_blob,m.w + (this->super_Padding).left + (this->super_Padding).right,
                    m.h + (this->super_Padding).top + (this->super_Padding).bottom,uVar12,_c,
                    m.elemsize,8,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          if ((int)_c < 1) {
            return 0;
          }
          uVar30 = 0;
          auVar52 = ZEXT3264(_DAT_005a5c40);
          auVar35 = vpcmpeqd_avx(auVar35,auVar35);
          auVar53 = ZEXT1664(auVar35);
          do {
            if (0 < (int)uVar12) {
              uVar11 = (ulong)(this->super_Padding).value;
              uVar11 = uVar11 << 0x38 | uVar11 << 0x30 | uVar11 << 0x28 |
                       uVar11 << 0x20 | uVar11 << 0x18 | uVar11 << 0x10 | uVar11 << 8 | uVar11;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = uVar11;
              auVar35 = vpshufd_avx(auVar35,0x44);
              auVar54._16_16_ = auVar35;
              auVar54._0_16_ = auVar35;
              uVar31 = 0;
              do {
                pMVar14 = (Mat *)(long)top_blob->w;
                iVar20 = top_blob->h;
                pvVar6 = top_blob->data;
                sVar7 = top_blob->elemsize;
                lVar19 = top_blob->cstep * uVar30;
                lVar15 = (long)iVar20 * (long)pMVar14;
                uVar21 = (int)uVar31 - (this->super_Padding).front;
                auVar35 = auVar53._0_16_;
                if ((int)uVar21 < 0 || iVar10 <= (int)uVar21) {
                  uVar21 = (uint)lVar15;
                  if (0 < (int)uVar21) {
                    auVar36._8_8_ = 0;
                    auVar36._0_8_ = (ulong)(uVar21 & 0x7fffffff) - 1;
                    auVar36 = vpshufd_avx(auVar36,0x44);
                    auVar37._0_8_ = auVar36._0_8_ ^ 0x8000000000000000;
                    auVar37._8_4_ = auVar36._8_4_;
                    auVar37._12_4_ = auVar36._12_4_ ^ 0x80000000;
                    auVar40._0_8_ = auVar36._0_8_ ^ 0x8000000000000000;
                    auVar40._8_4_ = auVar37._8_4_;
                    auVar40._12_4_ = auVar36._12_4_ ^ 0x80000000;
                    uVar13 = 0;
                    do {
                      auVar42._8_8_ = 0;
                      auVar42._0_8_ = uVar13;
                      auVar36 = vpshufd_avx(auVar42,0x44);
                      auVar44._16_16_ = auVar36;
                      auVar44._0_16_ = auVar36;
                      auVar44 = vorps_avx(auVar44,auVar52._0_32_);
                      auVar48._0_8_ = auVar44._16_8_ ^ 0x8000000000000000;
                      auVar48._8_4_ = auVar44._24_4_;
                      auVar48._12_4_ = auVar44._28_4_ ^ 0x80000000;
                      auVar36 = vpcmpgtq_avx(auVar48,auVar37);
                      auVar43._0_8_ = auVar44._0_8_ ^ 0x8000000000000000;
                      auVar43._8_4_ = auVar44._8_4_;
                      auVar43._12_4_ = auVar44._12_4_ ^ 0x80000000;
                      auVar42 = vpcmpgtq_avx(auVar43,auVar40);
                      auVar45._16_16_ = auVar36 ^ auVar35;
                      auVar45._0_16_ = auVar42 ^ auVar35;
                      auVar44 = vmaskmovpd_avx(auVar45,auVar54);
                      *(undefined1 (*) [32])
                       ((long)pvVar6 +
                       uVar13 * 8 + sVar7 * ((long)iVar20 * uVar31 * (long)pMVar14 + lVar19)) =
                           auVar44;
                      uVar13 = uVar13 + 4;
                    } while ((uVar21 + 3 & 0xfffffffc) != uVar13);
                  }
                }
                else {
                  m.w = bottom_blob->w;
                  m.h = bottom_blob->h;
                  m.elemsize = bottom_blob->elemsize;
                  m.elempack = bottom_blob->elempack;
                  m.allocator = bottom_blob->allocator;
                  m.cstep = (long)m.h * (long)m.w;
                  m.data = (void *)((long)bottom_blob->data +
                                   uVar21 * m.elemsize * m.cstep +
                                   bottom_blob->cstep * uVar30 * m.elemsize);
                  m.refcount = (int *)0x0;
                  m.dims = 2;
                  m.d = 1;
                  m.c = 1;
                  padding_constant_pack8_int8_sse
                            ((ncnn *)&m,
                             (Mat *)((long)pvVar6 + lVar15 * sVar7 * uVar31 + lVar19 * sVar7),
                             pMVar14,(this->super_Padding).top,(this->super_Padding).bottom,
                             (this->super_Padding).left,(this->super_Padding).right,uVar11);
                  auVar35 = vpcmpeqd_avx(auVar35,auVar35);
                  auVar53 = ZEXT1664(auVar35);
                  auVar52 = ZEXT3264(_DAT_005a5c40);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar12);
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 != _c);
          return 0;
        }
        return -100;
      }
    }
  }
  piVar8 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount = bottom_blob->refcount;
  m.allocator = bottom_blob->allocator;
  m.cstep = bottom_blob->cstep;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
  }
  m.d = iVar10;
  m.c = _c;
  if (m.elempack != 1) {
    opt_pack1.lightmode = opt->lightmode;
    opt_pack1.use_shader_pack8 = opt->use_shader_pack8;
    opt_pack1.use_subgroup_ops = opt->use_subgroup_ops;
    opt_pack1.use_reserved_0 = opt->use_reserved_0;
    opt_pack1.num_threads = opt->num_threads;
    opt_pack1.workspace_allocator = opt->workspace_allocator;
    opt_pack1.openmp_blocktime = opt->openmp_blocktime;
    opt_pack1.use_winograd_convolution = opt->use_winograd_convolution;
    opt_pack1.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_pack1.use_int8_inference = opt->use_int8_inference;
    opt_pack1.use_vulkan_compute = opt->use_vulkan_compute;
    opt_pack1.use_bf16_storage = opt->use_bf16_storage;
    opt_pack1.use_fp16_packed = opt->use_fp16_packed;
    opt_pack1.use_fp16_storage = opt->use_fp16_storage;
    opt_pack1.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_pack1.use_int8_packed = opt->use_int8_packed;
    opt_pack1.use_int8_storage = opt->use_int8_storage;
    opt_pack1.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_pack1.use_packing_layout = opt->use_packing_layout;
    opt_pack1.vulkan_device_index = opt->vulkan_device_index;
    opt_pack1.use_reserved_1 = opt->use_reserved_1;
    opt_pack1.use_image_storage = opt->use_image_storage;
    opt_pack1.use_tensor_storage = opt->use_tensor_storage;
    opt_pack1.use_reserved_2 = opt->use_reserved_2;
    opt_pack1.flush_denormals = opt->flush_denormals;
    opt_pack1.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_pack1.use_shader_local_memory = opt->use_shader_local_memory;
    opt_pack1.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_pack1.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_pack1.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_pack1.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_pack1.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_pack1.use_fp16_uniform = opt->use_fp16_uniform;
    opt_pack1.use_int8_uniform = opt->use_int8_uniform;
    opt_pack1.use_reserved_9 = opt->use_reserved_9;
    opt_pack1.use_reserved_10 = opt->use_reserved_10;
    opt_pack1.use_reserved_11 = opt->use_reserved_11;
    opt_pack1.blob_allocator = opt->workspace_allocator;
    convert_packing(bottom_blob,&m,1,&opt_pack1);
    if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
      iVar10 = -100;
      goto LAB_00410289;
    }
  }
  iVar10 = Padding::forward(&this->super_Padding,&m,top_blob,opt);
LAB_00410289:
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar10;
}

Assistant:

int Padding_x86_avx::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}